

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

bool __thiscall
HighsSymmetryDetection::mergeOrbits(HighsSymmetryDetection *this,HighsInt v1,HighsInt v2)

{
  int *piVar1;
  pointer piVar2;
  int iVar3;
  bool bVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  
  if (v1 == v2) {
    return false;
  }
  HVar5 = getOrbit(this,v1);
  HVar6 = getOrbit(this,v2);
  if (HVar5 == HVar6) {
    bVar4 = false;
  }
  else {
    iVar3 = HVar6;
    if (HVar6 < HVar5) {
      iVar3 = HVar5;
    }
    if (HVar5 < HVar6) {
      HVar6 = HVar5;
    }
    (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = HVar6;
    piVar2 = (this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = piVar2 + HVar6;
    *piVar1 = *piVar1 + piVar2[iVar3];
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool HighsSymmetryDetection::mergeOrbits(HighsInt v1, HighsInt v2) {
  if (v1 == v2) return false;

  HighsInt orbit1 = getOrbit(v1);
  HighsInt orbit2 = getOrbit(v2);

  if (orbit1 == orbit2) return false;

  if (orbit1 < orbit2) {
    orbitPartition[orbit2] = orbit1;
    orbitSize[orbit1] += orbitSize[orbit2];
  } else {
    orbitPartition[orbit1] = orbit2;
    orbitSize[orbit2] += orbitSize[orbit1];
  }

  return true;
}